

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

Clause * __thiscall Inferences::CompositeISE::simplify(CompositeISE *this,Clause *cl)

{
  int iVar1;
  ImmediateSimplificationEngine *pIVar2;
  undefined4 extraout_var;
  Clause *in_RSI;
  long in_RDI;
  Clause *newCl;
  ISList *curr;
  List<Inferences::ImmediateSimplificationEngine_*> *local_20;
  
  local_20 = *(List<Inferences::ImmediateSimplificationEngine_*> **)(in_RDI + 0x10);
  while( true ) {
    if (local_20 == (List<Inferences::ImmediateSimplificationEngine_*> *)0x0 ||
        in_RSI == (Clause *)0x0) {
      return in_RSI;
    }
    pIVar2 = Lib::List<Inferences::ImmediateSimplificationEngine_*>::head(local_20);
    iVar1 = (*(pIVar2->super_InferenceEngine)._vptr_InferenceEngine[6])(pIVar2,in_RSI);
    if ((Clause *)CONCAT44(extraout_var,iVar1) != in_RSI) break;
    local_20 = Lib::List<Inferences::ImmediateSimplificationEngine_*>::tail(local_20);
  }
  return (Clause *)CONCAT44(extraout_var,iVar1);
}

Assistant:

Clause* CompositeISE::simplify(Clause* cl)
{
  ISList* curr=_inners;
  while(curr && cl) {
    Clause* newCl=curr->head()->simplify(cl);
    if(newCl==cl) {
      curr=curr->tail();
    } else {
      return newCl;
    }
  }
  return cl;
}